

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerTest::SamplerTest
          (SamplerTest *this,TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc,
          TesterType tester,QueryType type)

{
  GLenum GVar1;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e76928;
  this->m_renderCtx = renderCtx;
  GVar1 = mapTesterToPname(tester);
  this->m_pname = GVar1;
  this->m_tester = tester;
  this->m_type = type;
  this->m_target = 0;
  return;
}

Assistant:

SamplerTest::SamplerTest (tcu::TestContext&			testCtx,
						  const glu::RenderContext&	renderCtx,
						  const char*				name,
						  const char*				desc,
						  TesterType				tester,
						  QueryType					type)
	: TestCase		(testCtx, name, desc)
	, m_renderCtx	(renderCtx)
	, m_pname		(mapTesterToPname(tester))
	, m_tester		(tester)
	, m_type		(type)
	, m_target		(0)
{
}